

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader_suite.cpp
# Opt level: O3

void number_suite::value_int32(void)

{
  bool bVar1;
  value vVar2;
  int iVar3;
  size_type sVar4;
  float fVar5;
  value_type input [5];
  reader reader;
  ulong local_b8;
  double local_b0 [4];
  uchar local_90 [8];
  reader local_88;
  
  local_90[4] = '\0';
  local_90[0] = 0xc4;
  local_90[1] = '\0';
  local_90[2] = '\0';
  local_90[3] = '\x01';
  trial::protocol::bintoken::reader::reader<unsigned_char[5]>(&local_88,(uchar (*) [5])local_90);
  local_b8._0_4_ = 0xc4;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::bintoken::token::code::value,trial::protocol::bintoken::token::code::value>
            ("reader.code()","token::code::int32",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/reader_suite.cpp"
             ,0x1c2,"void number_suite::value_int32()",local_b0,&local_b8);
  local_b0[0]._0_4_ =
       trial::protocol::bintoken::token::symbol::convert(local_88.decoder.current.code);
  local_b8._0_4_ = 4;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::bintoken::token::symbol::value,trial::protocol::bintoken::token::symbol::value>
            ("reader.symbol()","token::symbol::integer",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/reader_suite.cpp"
             ,0x1c3,"void number_suite::value_int32()",local_b0,&local_b8);
  vVar2 = trial::protocol::bintoken::token::symbol::convert(local_88.decoder.current.code);
  local_b0[0]._0_4_ = 0;
  if (vVar2 - null < 0xc) {
    local_b0[0]._0_4_ = *(value *)(&DAT_0011edac + (ulong)(vVar2 - null) * 4);
  }
  local_b8._0_4_ = 2;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::bintoken::token::category::value,trial::protocol::bintoken::token::category::value>
            ("reader.category()","token::category::data",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/reader_suite.cpp"
             ,0x1c4,"void number_suite::value_int32()",local_b0,&local_b8);
  sVar4 = trial::protocol::bintoken::reader::length(&local_88);
  boost::detail::test_impl
            ("reader.length() == 1",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/reader_suite.cpp"
             ,0x1c5,"void number_suite::value_int32()",sVar4 == 1);
  trial::protocol::bintoken::reader::overloader<trial::protocol::bintoken::token::boolean,_void>::
  convert(&local_88);
  boost::detail::throw_failed_impl
            ("reader.value<token::boolean>()","format::error",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/reader_suite.cpp"
             ,0x1c8,"void number_suite::value_int32()");
  trial::protocol::bintoken::reader::overloader<trial::protocol::bintoken::token::int8,_void>::
  convert(&local_88);
  boost::detail::throw_failed_impl
            ("reader.value<token::int8>()","format::error",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/reader_suite.cpp"
             ,0x1ca,"void number_suite::value_int32()");
  trial::protocol::bintoken::reader::overloader<trial::protocol::bintoken::token::int16,_void>::
  convert(&local_88);
  boost::detail::throw_failed_impl
            ("reader.value<token::int16>()","format::error",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/reader_suite.cpp"
             ,0x1cc,"void number_suite::value_int32()");
  local_b0[0]._0_4_ =
       trial::protocol::bintoken::reader::overloader<trial::protocol::bintoken::token::int32,_void>
       ::convert(&local_88);
  local_b8._0_4_ = 0x10000;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,int,int>
            ("reader.value<token::int32>()","0x10000",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/reader_suite.cpp"
             ,0x1cd,"void number_suite::value_int32()",local_b0,&local_b8);
  trial::protocol::bintoken::reader::overloader<trial::protocol::bintoken::token::int64,_void>::
  convert(&local_88);
  boost::detail::throw_failed_impl
            ("reader.value<token::int64>()","format::error",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/reader_suite.cpp"
             ,0x1cf,"void number_suite::value_int32()");
  trial::protocol::bintoken::reader::overloader<trial::protocol::bintoken::token::float32,_void>::
  convert(&local_88);
  boost::detail::throw_failed_impl
            ("reader.value<token::float32>()","format::error",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/reader_suite.cpp"
             ,0x1d1,"void number_suite::value_int32()");
  trial::protocol::bintoken::reader::overloader<trial::protocol::bintoken::token::float64,_void>::
  convert(&local_88);
  boost::detail::throw_failed_impl
            ("reader.value<token::float64>()","format::error",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/reader_suite.cpp"
             ,0x1d3,"void number_suite::value_int32()");
  trial::protocol::bintoken::reader::overloader<signed_char,_void>::convert(&local_88);
  boost::detail::throw_failed_impl
            ("reader.value<std::int8_t>()","format::error",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/reader_suite.cpp"
             ,0x1d6,"void number_suite::value_int32()");
  trial::protocol::bintoken::reader::overloader<short,_void>::convert(&local_88);
  boost::detail::throw_failed_impl
            ("reader.value<std::int16_t>()","format::error",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/reader_suite.cpp"
             ,0x1d8,"void number_suite::value_int32()");
  iVar3 = trial::protocol::bintoken::reader::overloader<int,_void>::convert(&local_88);
  local_b0[0] = (double)CONCAT44(local_b0[0]._4_4_,iVar3);
  local_b8 = CONCAT44(local_b8._4_4_,0x10000);
  boost::detail::test_with_impl<boost::detail::lw_test_eq,int,int>
            ("reader.value<token::int32::type>()","0x10000",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/reader_suite.cpp"
             ,0x1d9,"void number_suite::value_int32()",local_b0,&local_b8);
  local_b0[0] = (double)trial::protocol::bintoken::reader::overloader<long,_void>::convert
                                  (&local_88);
  local_b8 = 0x10000;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,long,unsigned_long>
            ("reader.value<token::int64::type>()","UINT64_C(0x10000)",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/reader_suite.cpp"
             ,0x1da,"void number_suite::value_int32()",local_b0,&local_b8);
  fVar5 = trial::protocol::bintoken::reader::overloader<float,_void>::convert(&local_88);
  local_b0[0] = (double)CONCAT44(local_b0[0]._4_4_,fVar5);
  local_b8 = CONCAT44(local_b8._4_4_,0x47800000);
  boost::detail::test_with_impl<boost::detail::lw_test_eq,float,float>
            ("reader.value<token::float32::type>()","65536.0f",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/reader_suite.cpp"
             ,0x1db,"void number_suite::value_int32()",local_b0,&local_b8);
  local_b0[0] = trial::protocol::bintoken::reader::overloader<double,_void>::convert(&local_88);
  local_b8 = 0x40f0000000000000;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,double,double>
            ("reader.value<token::float64::type>()","65536.0",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/reader_suite.cpp"
             ,0x1dc,"void number_suite::value_int32()",local_b0,&local_b8);
  bVar1 = trial::protocol::bintoken::reader::next(&local_88);
  local_b0[0] = (double)CONCAT71(local_b0[0]._1_7_,bVar1);
  local_b8 = local_b8 & 0xffffffffffffff00;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("reader.next()","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/reader_suite.cpp"
             ,0x1dd,"void number_suite::value_int32()",local_b0,&local_b8);
  local_b0[0] = (double)CONCAT44(local_b0[0]._4_4_,local_88.decoder.current.code);
  local_b8 = local_b8 & 0xffffffff00000000;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::bintoken::token::code::value,trial::protocol::bintoken::token::code::value>
            ("reader.code()","token::code::end",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/reader_suite.cpp"
             ,0x1de,"void number_suite::value_int32()",local_b0,&local_b8);
  std::
  _Deque_base<trial::protocol::bintoken::token::code::value,_std::allocator<trial::protocol::bintoken::token::code::value>_>
  ::~_Deque_base((_Deque_base<trial::protocol::bintoken::token::code::value,_std::allocator<trial::protocol::bintoken::token::code::value>_>
                  *)&local_88.stack);
  return;
}

Assistant:

void value_int32()
{
    const value_type input[] = { token::code::int32, 0x00, 0x00, 0x01, 0x00 };
    format::reader reader(input);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.code(), token::code::int32);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.symbol(), token::symbol::integer);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.category(), token::category::data);
    TRIAL_PROTOCOL_TEST(reader.length() == 1);
    // Without conversion
    TRIAL_PROTOCOL_TEST_THROW_EQUAL(reader.value<token::boolean>(),
                                    format::error, "incompatible type");
    TRIAL_PROTOCOL_TEST_THROW_EQUAL(reader.value<token::int8>(),
                                    format::error, "incompatible type");
    TRIAL_PROTOCOL_TEST_THROW_EQUAL(reader.value<token::int16>(),
                                    format::error, "incompatible type");
    TRIAL_PROTOCOL_TEST_EQUAL(reader.value<token::int32>(), 0x10000);
    TRIAL_PROTOCOL_TEST_THROW_EQUAL(reader.value<token::int64>(),
                                    format::error, "incompatible type");
    TRIAL_PROTOCOL_TEST_THROW_EQUAL(reader.value<token::float32>(),
                                    format::error, "incompatible type");
    TRIAL_PROTOCOL_TEST_THROW_EQUAL(reader.value<token::float64>(),
                                    format::error, "incompatible type");
    // With conversion
    TRIAL_PROTOCOL_TEST_THROW_EQUAL(reader.value<std::int8_t>(),
                                    format::error, "overflow");
    TRIAL_PROTOCOL_TEST_THROW_EQUAL(reader.value<std::int16_t>(),
                                    format::error, "overflow");
    TRIAL_PROTOCOL_TEST_EQUAL(reader.value<token::int32::type>(), 0x10000);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.value<token::int64::type>(), UINT64_C(0x10000));
    TRIAL_PROTOCOL_TEST_EQUAL(reader.value<token::float32::type>(), 65536.0f);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.value<token::float64::type>(), 65536.0);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.next(), false);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.code(), token::code::end);
}